

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Inline_Array_AST_Node::eval_internal
          (Inline_Array_AST_Node *this,Dispatch_State *t_ss)

{
  Dispatch_Engine *pDVar1;
  long lVar2;
  undefined8 *puVar3;
  string *t_name;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::AST_Node> *child;
  undefined8 *puVar4;
  Boxed_Value BVar5;
  initializer_list<chaiscript::Boxed_Value> __l;
  allocator_type local_da;
  allocator local_d9;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> vec;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_98;
  Boxed_Value obj;
  atomic_uint_fast32_t local_78 [4];
  undefined1 local_58 [16];
  Type_Conversions_State local_48;
  
  vec.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vec.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vec.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar1 = t_ss[3].m_engine._M_data;
  if (pDVar1 != (Dispatch_Engine *)t_ss[3].m_stack_holder._M_data) {
    lVar2 = (pDVar1->m_mutex).super_mutex.super___mutex_base._M_mutex.__align;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::reserve
              (&vec,*(long *)(lVar2 + 0x68) - *(long *)(lVar2 + 0x60) >> 4);
    lVar2 = ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.__align;
    puVar3 = *(undefined8 **)(lVar2 + 0x68);
    for (puVar4 = *(undefined8 **)(lVar2 + 0x60); puVar4 != puVar3; puVar4 = puVar4 + 2) {
      AST_Node::eval((AST_Node *)&obj,(Dispatch_State *)*puVar4);
      if ((obj.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->m_return_value == false) {
        t_name = (string *)*in_RDX;
        std::__cxx11::string::string((string *)local_78,"clone",&local_d9);
        std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_98,
                   (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&obj);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_98;
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                  ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   &local_48,__l,&local_da);
        chaiscript::detail::Dispatch_Engine::call_function
                  ((Dispatch_Engine *)local_58,t_name,local_78,
                   (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   &t_ss[4].m_stack_holder,&local_48);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
        emplace_back<chaiscript::Boxed_Value>(&vec,(Boxed_Value *)local_58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                  ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   &local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
        std::__cxx11::string::~string((string *)local_78);
      }
      else {
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
        emplace_back<chaiscript::Boxed_Value>(&vec,&obj);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&obj.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  chaiscript::detail::
  const_var_impl<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)this);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&vec);
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE {
          try {
            std::vector<Boxed_Value> vec;
            if (!children.empty()) {
              vec.reserve(children[0]->children.size());
              for (const auto &child : children[0]->children) {
                auto obj = child->eval(t_ss);
                if (!obj.is_return_value()) {
                  vec.push_back(t_ss->call_function("clone", m_loc, {obj}, t_ss.conversions()));
                } else {
                  vec.push_back(std::move(obj));
                }
              }
            }
            return const_var(std::move(vec));
          }
          catch (const exception::dispatch_error &) {
            throw exception::eval_error("Can not find appropriate 'clone' or copy constructor for vector elements");
          }
        }